

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Qentem::Array<Qentem::Value<char>_>::Reset(Array<Qentem::Value<char>_> *this)

{
  Value<char> *pVVar1;
  Value<char> *this_00;
  
  if ((ulong)this->index_ != 0) {
    this_00 = this->storage_;
    pVVar1 = this_00 + this->index_;
    do {
      if (this_00 != (Value<char> *)0x0) {
        Value<char>::~Value(this_00);
      }
      this_00 = this_00 + 1;
    } while (this_00 < pVVar1);
  }
  pVVar1 = this->storage_;
  if (pVVar1 != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(pVVar1);
  }
  operator_delete(pVVar1);
  this->storage_ = (Value<char> *)0x0;
  this->index_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void Reset() noexcept {
        Memory::Dispose(Storage(), End());
        Memory::Deallocate(Storage());

        clearStorage();
        setSize(0);
        setCapacity(0);
    }